

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

void pageant_passphrase_request_success(PageantClientDialogId *dlgid,ptrlen passphrase)

{
  PageantClientDialogId *pPVar1;
  _Bool _Var2;
  strbuf *buf_o;
  ssh2_userkey *psVar3;
  char *reason;
  PageantKeyRequestNode *pPVar4;
  char *error;
  BinarySource src [1];
  char *local_50;
  BinarySource local_48;
  
  if (gui_request_in_progress == '\0') {
    __assert_fail("gui_request_in_progress",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                  0x217,"void pageant_passphrase_request_success(PageantClientDialogId *, ptrlen)");
  }
  gui_request_in_progress = 0;
  *(undefined1 *)&dlgid[-6].dummy = 0;
  if (*(long *)(dlgid + -10) == 0) {
    local_48.data = *(void **)(*(long *)(dlgid + -8) + 8);
    local_48.len = *(size_t *)(*(long *)(dlgid + -8) + 0x10);
    local_48.pos = 0;
    local_48.err = BSE_NO_ERROR;
    local_48.binarysource_ = &local_48;
    buf_o = strbuf_dup_nm(passphrase);
    psVar3 = ppk_load_s(&local_48,buf_o->s,&local_50);
    *(ssh2_userkey **)(dlgid + -10) = psVar3;
    strbuf_free(buf_o);
    if (*(ssh2_userkey **)(dlgid + -10) == (ssh2_userkey *)0x0) {
      reason = "unable to decrypt key";
    }
    else {
      if (*(ssh2_userkey **)(dlgid + -10) != &ssh2_wrong_passphrase) {
        keylist_update();
        goto LAB_00112d50;
      }
      *(undefined8 *)(dlgid + -10) = 0;
      pPVar1 = *(PageantClientDialogId **)(dlgid + -2);
      if (pPVar1 == dlgid + -4) {
        return;
      }
      *(undefined1 *)&dlgid[-6].dummy = 0;
      _Var2 = request_passphrase((PageantClient *)**(undefined8 **)(pPVar1 + 6),
                                 (PageantKey *)(dlgid + -0x14));
      if (_Var2) {
        return;
      }
      reason = "unable to continue creating passphrase prompts";
    }
    fail_requests_for_key((PageantKey *)(dlgid + -0x14),reason);
  }
  else {
LAB_00112d50:
    pPVar4 = requests_blocked_on_gui.next;
    for (pPVar1 = *(PageantClientDialogId **)(dlgid + -2); requests_blocked_on_gui.next = pPVar4,
        pPVar1 != dlgid + -4; pPVar1 = *(PageantClientDialogId **)(pPVar1 + 2)) {
      queue_toplevel_callback(pageant_async_op_callback,pPVar1 + 4);
      pPVar4 = requests_blocked_on_gui.next;
    }
    if (pPVar4 != &requests_blocked_on_gui) {
      do {
        queue_toplevel_callback(pageant_async_op_callback,pPVar4 + 1);
        pPVar4 = pPVar4->next;
      } while (pPVar4 != &requests_blocked_on_gui);
    }
  }
  return;
}

Assistant:

void pageant_passphrase_request_success(PageantClientDialogId *dlgid,
                                        ptrlen passphrase)
{
    PageantKey *pk = container_of(dlgid, PageantKey, dlgid);

    assert(gui_request_in_progress);
    gui_request_in_progress = false;
    pk->decryption_prompt_active = false;

    if (!pk->skey) {
        const char *error;

        BinarySource src[1];
        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(
                                      pk->encrypted_key_file));

        strbuf *ppsb = strbuf_dup_nm(passphrase);
        pk->skey = ppk_load_s(src, ppsb->s, &error);
        strbuf_free(ppsb);

        if (!pk->skey) {
            fail_requests_for_key(pk, "unable to decrypt key");
            return;
        } else if (pk->skey == SSH2_WRONG_PASSPHRASE) {
            pk->skey = NULL;

            /*
             * Find a PageantClient to use for another attempt at
             * request_passphrase.
             */
            PageantKeyRequestNode *pkr = pk->blocked_requests.next;
            if (pkr == &pk->blocked_requests) {
                /*
                 * Special case: if all the requests have gone away at
                 * this point, we need not bother putting up a request
                 * at all any more.
                 */
                return;
            }

            PageantSignOp *so = container_of(pk->blocked_requests.next,
                                             PageantSignOp, pkr);

            pk->decryption_prompt_active = false;
            if (!request_passphrase(so->pao.info->pc, pk)) {
                fail_requests_for_key(pk, "unable to continue creating "
                                      "passphrase prompts");
            }
            return;
        } else {
            keylist_update();
        }
    }

    unblock_requests_for_key(pk);

    unblock_pending_gui_requests();
}